

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Request * __thiscall
kj::anon_unknown_31::HttpClientImpl::request
          (Request *__return_storage_ptr__,HttpClientImpl *this,HttpMethod method,StringPtr url,
          HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  ArrayPtr<const_kj::StringPtr> connectionHeaders_00;
  Fault this_00;
  bool bVar1;
  Own<kj::AsyncOutputStream> *other;
  Promise<kj::HttpClient::Response> *pPVar2;
  unsigned_long *params;
  bool local_2a9;
  bool local_299;
  ArrayDisposer **local_288;
  HttpClientImpl *local_258;
  HttpMethod local_250;
  uint local_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:3197:11),_kj::Maybe<kj::HttpHeaders::Response>_>
  responsePromise;
  undefined1 local_220 [4];
  uint id;
  Own<kj::AsyncOutputStream> local_210;
  Own<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter> local_200;
  Own<kj::AsyncOutputStream> local_1f0;
  RemoveConst<kj::HttpHeaders::Header> *local_1e0;
  unsigned_long *s_1;
  Own<kj::AsyncOutputStream> local_1c8;
  undefined1 local_1b8 [8];
  Own<kj::AsyncOutputStream> bodyStream;
  Disposer *pDStack_1a0;
  String local_188;
  StringPtr local_170;
  byte local_159;
  undefined8 local_158;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  Maybe<kj::StringPtr> local_140;
  StringPtr local_128;
  String local_118;
  kj *local_100;
  unsigned_long *s;
  undefined1 local_f0 [6];
  bool hasBody;
  bool isGet;
  String lengthStr;
  StringPtr connectionHeaders [7];
  Fault local_60;
  Fault f_2;
  Fault f_1;
  Fault local_40;
  Fault f;
  HttpHeaders *headers_local;
  HttpMethod method_local;
  HttpClientImpl *this_local;
  StringPtr url_local;
  
  f.exception = (Exception *)headers;
  if (((this->upgraded ^ 0xffU) & 1) == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xc48,FAILED,"!upgraded",
               "\"can\'t make further requests on this HttpClient because it has been or is in the process \" \"of being upgraded\""
               ,(char (*) [106])
                "can\'t make further requests on this HttpClient because it has been or is in the process of being upgraded"
              );
    _::Debug::Fault::fatal(&local_40);
  }
  if (((this->closed ^ 0xffU) & 1) != 0) {
    bVar1 = HttpOutputStream::canReuse(&this->httpOutput);
    if (bVar1) {
      Maybe<kj::Promise<void>_>::operator=(&this->closeWatcherTask,(void *)0x0);
      local_288 = &lengthStr.content.disposer;
      do {
        StringPtr::StringPtr((StringPtr *)local_288);
        local_288 = local_288 + 2;
      } while (local_288 != (ArrayDisposer **)&connectionHeaders[6].content.size_);
      String::String((String *)local_f0);
      local_299 = method < POST;
      s._7_1_ = local_299;
      local_100 = (kj *)_::readMaybe<unsigned_long>(expectedBodySize);
      if (local_100 == (kj *)0x0) {
        local_159 = 0;
        local_2a9 = false;
        if ((s._7_1_ & 1) != 0) {
          local_158 = 0;
          uStack_150 = 6;
          uStack_14c = 0;
          HttpHeaders::get(&local_140,(HttpHeaders *)f.exception,(HttpHeaderId)(ZEXT416(6) << 0x40))
          ;
          local_159 = 1;
          local_2a9 = Maybe<kj::StringPtr>::operator==(&local_140,(void *)0x0);
        }
        if ((local_159 & 1) != 0) {
          Maybe<kj::StringPtr>::~Maybe(&local_140);
        }
        bVar1 = local_2a9 == false;
        s._6_1_ = bVar1;
        if (bVar1) {
          StringPtr::StringPtr(&local_170,"chunked");
          connectionHeaders[5].content.size_ = (size_t)local_170.content.ptr;
          connectionHeaders[6].content.ptr = (char *)local_170.content.size_;
        }
      }
      else if (((s._7_1_ & 1) == 0) || (*(long *)local_100 != 0)) {
        str<unsigned_long&>(&local_118,local_100,params);
        String::operator=((String *)local_f0,&local_118);
        String::~String(&local_118);
        StringPtr::StringPtr(&local_128,(String *)local_f0);
        connectionHeaders[4].content.size_ = (size_t)local_128.content.ptr;
        connectionHeaders[5].content.ptr = (char *)local_128.content.size_;
        s._6_1_ = true;
      }
      else {
        s._6_1_ = false;
      }
      this_00.exception = f.exception;
      ArrayPtr<kj::StringPtr_const>::ArrayPtr<7ul>
                ((ArrayPtr<kj::StringPtr_const> *)&bodyStream.ptr,
                 (StringPtr (*) [7])&lengthStr.content.disposer);
      connectionHeaders_00.size_ = (size_t)pDStack_1a0;
      connectionHeaders_00.ptr = (StringPtr *)bodyStream.ptr;
      HttpHeaders::serializeRequest
                (&local_188,(HttpHeaders *)this_00.exception,method,url,connectionHeaders_00);
      HttpOutputStream::writeHeaders(&this->httpOutput,&local_188);
      String::~String(&local_188);
      Own<kj::AsyncOutputStream>::Own((Own<kj::AsyncOutputStream> *)local_1b8);
      if ((s._6_1_ & 1) == 0) {
        HttpOutputStream::finishBody(&this->httpOutput);
        heap<kj::(anonymous_namespace)::HttpNullEntityWriter>();
        Own<kj::AsyncOutputStream>::Own<kj::(anonymous_namespace)::HttpNullEntityWriter,void>
                  (&local_1c8,(Own<kj::(anonymous_namespace)::HttpNullEntityWriter> *)&s_1);
        Own<kj::AsyncOutputStream>::operator=((Own<kj::AsyncOutputStream> *)local_1b8,&local_1c8);
        Own<kj::AsyncOutputStream>::~Own(&local_1c8);
        Own<kj::(anonymous_namespace)::HttpNullEntityWriter>::~Own
                  ((Own<kj::(anonymous_namespace)::HttpNullEntityWriter> *)&s_1);
      }
      else {
        local_1e0 = (RemoveConst<kj::HttpHeaders::Header> *)
                    _::readMaybe<unsigned_long>(expectedBodySize);
        if (local_1e0 == (RemoveConst<kj::HttpHeaders::Header> *)0x0) {
          heap<kj::(anonymous_namespace)::HttpChunkedEntityWriter,kj::(anonymous_namespace)::HttpOutputStream&>
                    ((kj *)local_220,&this->httpOutput);
          Own<kj::AsyncOutputStream>::Own<kj::(anonymous_namespace)::HttpChunkedEntityWriter,void>
                    (&local_210,(Own<kj::(anonymous_namespace)::HttpChunkedEntityWriter> *)local_220
                    );
          Own<kj::AsyncOutputStream>::operator=((Own<kj::AsyncOutputStream> *)local_1b8,&local_210);
          Own<kj::AsyncOutputStream>::~Own(&local_210);
          Own<kj::(anonymous_namespace)::HttpChunkedEntityWriter>::~Own
                    ((Own<kj::(anonymous_namespace)::HttpChunkedEntityWriter> *)local_220);
        }
        else {
          heap<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,kj::(anonymous_namespace)::HttpOutputStream&,unsigned_long&>
                    ((kj *)&local_200,&this->httpOutput,(unsigned_long *)local_1e0);
          Own<kj::AsyncOutputStream>::
          Own<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,void>(&local_1f0,&local_200);
          Own<kj::AsyncOutputStream>::operator=((Own<kj::AsyncOutputStream> *)local_1b8,&local_1f0);
          Own<kj::AsyncOutputStream>::~Own(&local_1f0);
          Own<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter>::~Own(&local_200);
        }
      }
      responsePromise.super_PromiseBase.node.ptr._4_4_ = this->counter + 1;
      this->counter = responsePromise.super_PromiseBase.node.ptr._4_4_;
      HttpInputStreamImpl::readResponseHeaders((HttpInputStreamImpl *)local_248);
      local_24c = responsePromise.super_PromiseBase.node.ptr._4_4_;
      local_258 = this;
      local_250 = method;
      Promise<kj::Maybe<kj::HttpHeaders::Response>>::
      then<kj::(anonymous_namespace)::HttpClientImpl::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda(kj::Maybe<kj::HttpHeaders::Response>&&)_1_,kj::_::PropagateException>
                ((Promise<kj::Maybe<kj::HttpHeaders::Response>> *)local_238,(Type *)local_248,
                 (PropagateException *)&local_258);
      Promise<kj::Maybe<kj::HttpHeaders::Response>_>::~Promise
                ((Promise<kj::Maybe<kj::HttpHeaders::Response>_> *)local_248);
      other = mv<kj::Own<kj::AsyncOutputStream>>((Own<kj::AsyncOutputStream> *)local_1b8);
      Own<kj::AsyncOutputStream>::Own(&__return_storage_ptr__->body,other);
      pPVar2 = mv<kj::Promise<kj::HttpClient::Response>>
                         ((Promise<kj::HttpClient::Response> *)local_238);
      Promise<kj::HttpClient::Response>::Promise(&__return_storage_ptr__->response,pPVar2);
      Promise<kj::HttpClient::Response>::~Promise((Promise<kj::HttpClient::Response> *)local_238);
      Own<kj::AsyncOutputStream>::~Own((Own<kj::AsyncOutputStream> *)local_1b8);
      String::~String((String *)local_f0);
      return __return_storage_ptr__;
    }
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[75]>
              (&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xc4c,FAILED,"httpOutput.canReuse()",
               "\"can\'t start new request until previous request body has been fully written\"",
               (char (*) [75])
               "can\'t start new request until previous request body has been fully written");
    _::Debug::Fault::fatal(&local_60);
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[78]>
            (&f_2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
             ,0xc4a,FAILED,"!closed",
             "\"this HttpClient\'s connection has been closed by the server or due to an error\"",
             (char (*) [78])
             "this HttpClient\'s connection has been closed by the server or due to an error");
  _::Debug::Fault::fatal(&f_2);
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
    KJ_REQUIRE(!upgraded,
        "can't make further requests on this HttpClient because it has been or is in the process "
        "of being upgraded");
    KJ_REQUIRE(!closed,
        "this HttpClient's connection has been closed by the server or due to an error");
    KJ_REQUIRE(httpOutput.canReuse(),
        "can't start new request until previous request body has been fully written");
    closeWatcherTask = nullptr;

    kj::StringPtr connectionHeaders[HttpHeaders::CONNECTION_HEADERS_COUNT];
    kj::String lengthStr;

    bool isGet = method == HttpMethod::GET || method == HttpMethod::HEAD;
    bool hasBody;

    KJ_IF_MAYBE(s, expectedBodySize) {
      if (isGet && *s == 0) {
        // GET with empty body; don't send any Content-Length.
        hasBody = false;
      } else {
        lengthStr = kj::str(*s);
        connectionHeaders[HttpHeaders::BuiltinIndices::CONTENT_LENGTH] = lengthStr;
        hasBody = true;
      }
    } else {
      if (isGet && headers.get(HttpHeaderId::TRANSFER_ENCODING) == nullptr) {
        // GET with empty body; don't send any Transfer-Encoding.
        hasBody = false;
      } else {
        // HACK: Normally GET requests shouldn't have bodies. But, if the caller set a
        //   Transfer-Encoding header on a GET, we use this as a special signal that it might
        //   actually want to send a body. This allows pass-through of a GET request with a chunked
        //   body to "just work". We strongly discourage writing any new code that sends
        //   full-bodied GETs.
        connectionHeaders[HttpHeaders::BuiltinIndices::TRANSFER_ENCODING] = "chunked";
        hasBody = true;
      }
    }

    httpOutput.writeHeaders(headers.serializeRequest(method, url, connectionHeaders));

    kj::Own<kj::AsyncOutputStream> bodyStream;
    if (!hasBody) {
      // No entity-body.
      httpOutput.finishBody();
      bodyStream = heap<HttpNullEntityWriter>();
    } else KJ_IF_MAYBE(s, expectedBodySize) {
      bodyStream = heap<HttpFixedLengthEntityWriter>(httpOutput, *s);
    } else {
      bodyStream = heap<HttpChunkedEntityWriter>(httpOutput);
    }